

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase176::run(TestCase176 *this)

{
  SourceLocation location;
  bool bVar1;
  int iVar2;
  AsyncIoProvider *pAVar3;
  undefined4 extraout_var;
  int *in_RCX;
  undefined8 in_stack_fffffffffffffdc0;
  bool local_209;
  DebugExpression<const_char_(&)[4]> DStack_208;
  bool _kj_shouldLog;
  undefined1 local_200 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  SourceLocation local_1d0;
  undefined1 *local_1b8;
  AsyncIoStream **local_1b0;
  undefined1 *local_1a8;
  AsyncIoStream **local_1a0;
  undefined1 *local_198;
  String local_190;
  StringPtr local_178;
  undefined1 local_168 [8];
  Type local_160;
  Promise<unsigned_long> local_150;
  undefined1 local_148 [8];
  String result;
  Type local_110;
  Promise<void> local_108 [2];
  undefined1 local_f8 [24];
  undefined1 local_e0 [8];
  PromiseFulfillerPair<void> ready;
  undefined1 local_c0 [4];
  char receiveBuffer [4];
  Own<kj::AsyncIoStream,_std::nullptr_t> client;
  Own<kj::AsyncIoStream,_std::nullptr_t> server;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  undefined1 local_88 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:181:3)>
  _kjDefer181;
  undefined1 local_70 [8];
  String path;
  Network *network;
  AsyncIoContext ioContext;
  TestCase176 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar3 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  iVar2 = (*pAVar3->_vptr_AsyncIoProvider[3])();
  _kjDefer181.maybeFunc.ptr.field_1._4_4_ = getpid();
  str<char_const(&)[23],int>
            ((String *)local_70,(kj *)"/tmp/kj-async-io-test.",
             (char (*) [23])((long)&_kjDefer181.maybeFunc.ptr.field_1 + 4),in_RCX);
  listener.ptr = (ConnectionReceiver *)local_70;
  defer<kj::(anonymous_namespace)::TestCase176::run()::__0>((kj *)local_88,(Type *)&listener.ptr);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::Own
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&server.ptr);
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)&client.ptr)
  ;
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_c0);
  ready.fulfiller.ptr._4_4_ = 0;
  SourceLocation::SourceLocation
            ((SourceLocation *)local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0xbd,0x10);
  location.function = (char *)local_f8._16_8_;
  location.fileName = (char *)local_f8._8_8_;
  location.lineNumber = (int)in_stack_fffffffffffffdc0;
  location.columnNumber = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  newPromiseAndFulfiller<void>(location);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase176::run()::__1>
            ((Promise<void> *)&local_110,(Type *)local_e0);
  Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::TestCase176::run()::__2>
            ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)local_108,&local_110);
  Promise<void>::detach<kj::(anonymous_namespace)::TestCase176::run()::__3>
            (local_108,(Type *)((long)&result.content.disposer + 7));
  Promise<void>::~Promise(local_108);
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_110);
  str<char_const(&)[6],kj::String&>
            (&local_190,(kj *)"unix:",(char (*) [6])local_70,(String *)local_f8._16_8_);
  StringPtr::StringPtr(&local_178,&local_190);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (local_168,(undefined8 *)CONCAT44(extraout_var,iVar2),local_178.content.ptr,
             local_178.content.size_,0);
  local_1a0 = &server.ptr;
  local_198 = local_e0;
  Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::TestCase176::run()::__4>
            ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)(local_168 + 8),
             (Type *)local_168);
  local_1b0 = &client.ptr;
  local_1a8 = (undefined1 *)((long)&ready.fulfiller.ptr + 4);
  Promise<kj::AuthenticatedStream>::then<kj::(anonymous_namespace)::TestCase176::run()::__5>
            ((Promise<kj::AuthenticatedStream> *)&local_160.receiveBuffer,(Type *)(local_168 + 8));
  local_1b8 = (undefined1 *)((long)&ready.fulfiller.ptr + 4);
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase176::run()::__6>
            (&local_150,(Type *)&local_160.receiveBuffer);
  SourceLocation::SourceLocation
            (&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0xda,0x17);
  Promise<kj::String>::wait((Promise<kj::String> *)local_148,&local_150);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_150);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_160.receiveBuffer);
  Promise<kj::AuthenticatedStream>::~Promise((Promise<kj::AuthenticatedStream> *)(local_168 + 8));
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)local_168);
  String::~String(&local_190);
  DStack_208 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x9422c6);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_200,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffdf8,(String *)local_148);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
  if (!bVar1) {
    local_209 = kj::_::Debug::shouldLog(ERROR);
    while (local_209 != false) {
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result"
                 ,(char (*) [37])"failed: expected (\"foo\") == (result)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_200,
                 (char (*) [4])0x9422c6,(String *)local_148);
      local_209 = false;
    }
  }
  String::~String((String *)local_148);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_e0);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_c0);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&client.ptr);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::~Own
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&server.ptr);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:181:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:181:3)>
               *)local_88);
  String::~String((String *)local_70);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&network);
  return;
}

Assistant:

TEST(AsyncIo, UnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  auto path = kj::str(TMPDIR "/kj-async-io-test.", getpid());
  KJ_DEFER(unlink(path.cStr()));

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4]{};

  auto ready = newPromiseAndFulfiller<void>();

  ready.promise.then([&]() {
    return network.parseAddress(kj::str("unix:", path));
  }).then([&](Own<NetworkAddress>&& addr) {
    auto promise = addr->connectAuthenticated();
    return promise.then([&,addr=kj::mv(addr)](AuthenticatedStream result) mutable {
      auto id = result.peerIdentity.downcast<LocalPeerIdentity>();
      auto creds = id->getCredentials();
      KJ_IF_SOME(p, creds.pid) {
        KJ_EXPECT(p == getpid());
#if __linux__ || __APPLE__
      } else {
        KJ_FAIL_EXPECT("LocalPeerIdentity for unix socket had null PID");
#endif
      }
      KJ_IF_SOME(u, creds.uid) {
        KJ_EXPECT(u == getuid());
      } else {
        KJ_FAIL_EXPECT("LocalPeerIdentity for unix socket had null UID");
      }

      client = kj::mv(result.stream);
      return client->write("foo"_kjb);
    });
  }